

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O1

int __thiscall CImage::LoadTga(CImage *this,char *szFilename)

{
  unsigned_short uVar1;
  int iVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  byte bVar6;
  uchar uVar7;
  int iVar8;
  FILE *__stream;
  size_t sVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  uchar *puVar13;
  ulong __n;
  _TGAHEADER fh;
  uchar BmpPal [256] [4];
  int local_470;
  int local_460;
  undefined1 local_44a;
  char local_449;
  byte local_448;
  ushort local_445;
  char local_443;
  ushort local_43e;
  ushort local_43c;
  byte local_43a;
  uchar local_438 [1032];
  
  __stream = fopen(szFilename,"rb");
  this->f = (FILE *)__stream;
  if (__stream == (FILE *)0x0) {
    return 0x32;
  }
  sVar9 = fread(&local_44a,0x12,1,__stream);
  if (sVar9 == 1) {
    if ((byte)(local_43a - 0x21) < 0xe0) {
      return 0x34;
    }
    iVar8 = Init(this,(uint)local_43e,(uint)local_43c,(ushort)local_43a);
    if (iVar8 != 0) {
      return 0x35;
    }
    uVar1 = this->m_BitPerPixel;
    if (uVar1 == 0x20) {
      puVar13 = this->m_pBitmap + (long)this->m_NumPixel * 4;
      if ((local_448 & 8) == 0) {
        if (0 < this->m_Yres) {
          iVar8 = 0;
          do {
            puVar13 = puVar13 + (long)this->m_Xres * -4;
            sVar9 = fread(puVar13,4,(long)this->m_Xres,(FILE *)this->f);
            if (sVar9 != (long)this->m_Xres) goto LAB_0037e3d4;
            iVar8 = iVar8 + 1;
          } while (iVar8 < this->m_Yres);
        }
      }
      else {
        puVar13 = puVar13 + (long)this->m_Xres * -4;
        this->m_nCount = 0x8000;
        if (this->m_pBitmap <= puVar13) {
          iVar8 = 0;
LAB_0037e0fa:
          bVar6 = Input(this);
          lVar11 = (long)iVar8;
          if ((char)bVar6 < '\0') {
            uVar7 = Input(this);
            uVar3 = Input(this);
            uVar4 = Input(this);
            uVar5 = Input(this);
            lVar12 = 0;
            do {
              puVar13[lVar12 + lVar11 * 4] = uVar7;
              puVar13[lVar12 + lVar11 * 4 + 1] = uVar3;
              puVar13[lVar12 + lVar11 * 4 + 2] = uVar4;
              puVar13[lVar12 + lVar11 * 4 + 3] = uVar5;
              iVar2 = this->m_Xres;
              iVar8 = iVar8 + 1;
              if (iVar8 == iVar2) goto LAB_0037e229;
              lVar12 = lVar12 + 4;
            } while ((uint)bVar6 * 4 + -0x1fc != (int)lVar12);
          }
          else {
            local_460 = (uint)bVar6 * 4 + 4;
            lVar12 = 0;
            do {
              uVar7 = Input(this);
              uVar3 = Input(this);
              uVar4 = Input(this);
              uVar5 = Input(this);
              puVar13[lVar12 + lVar11 * 4] = uVar7;
              puVar13[lVar12 + lVar11 * 4 + 1] = uVar3;
              puVar13[lVar12 + lVar11 * 4 + 2] = uVar4;
              puVar13[lVar12 + lVar11 * 4 + 3] = uVar5;
              iVar2 = this->m_Xres;
              iVar8 = iVar8 + 1;
              if (iVar8 == iVar2) goto LAB_0037e229;
              lVar12 = lVar12 + 4;
            } while (local_460 != (int)lVar12);
          }
          goto LAB_0037e22c;
        }
      }
    }
    else if (uVar1 == 0x18) {
      puVar13 = this->m_pBitmap + (long)this->m_NumPixel * 3;
      if ((local_448 & 8) == 0) {
        if (0 < this->m_Yres) {
          iVar8 = 0;
          do {
            puVar13 = puVar13 + (long)this->m_Xres * -3;
            sVar9 = fread(puVar13,3,(long)this->m_Xres,(FILE *)this->f);
            if (sVar9 != (long)this->m_Xres) goto LAB_0037e3d4;
            iVar8 = iVar8 + 1;
          } while (iVar8 < this->m_Yres);
        }
      }
      else {
        puVar13 = puVar13 + (long)this->m_Xres * -3;
        this->m_nCount = 0x8000;
        if (this->m_pBitmap <= puVar13) {
          iVar8 = 0;
          do {
            bVar6 = Input(this);
            lVar11 = (long)iVar8;
            if ((char)bVar6 < '\0') {
              uVar7 = Input(this);
              uVar3 = Input(this);
              uVar4 = Input(this);
              lVar12 = 0;
              do {
                puVar13[lVar12 + lVar11 * 3] = uVar7;
                puVar13[lVar12 + lVar11 * 3 + 1] = uVar3;
                puVar13[lVar12 + lVar11 * 3 + 2] = uVar4;
                iVar8 = iVar8 + 1;
                if (iVar8 == this->m_Xres) {
                  puVar13 = puVar13 + (long)this->m_Xres * -3;
                  iVar8 = 0;
                  break;
                }
                lVar12 = lVar12 + 3;
              } while ((uint)bVar6 * 3 + -0x17d != (int)lVar12);
            }
            else {
              local_470 = (uint)bVar6 * 3 + 3;
              lVar12 = 0;
              do {
                uVar7 = Input(this);
                uVar3 = Input(this);
                uVar4 = Input(this);
                puVar13[lVar12 + lVar11 * 3] = uVar7;
                puVar13[lVar12 + lVar11 * 3 + 1] = uVar3;
                puVar13[lVar12 + lVar11 * 3 + 2] = uVar4;
                iVar8 = iVar8 + 1;
                if (iVar8 == this->m_Xres) {
                  puVar13 = puVar13 + (long)this->m_Xres * -3;
                  iVar8 = 0;
                  break;
                }
                lVar12 = lVar12 + 3;
              } while (local_470 != (int)lVar12);
            }
          } while (this->m_pBitmap <= puVar13);
        }
      }
    }
    else {
      if (uVar1 != 8) {
        return 0x36;
      }
      if (local_449 == '\x01') {
        if (local_443 == ' ') {
          __n = (ulong)local_445;
          sVar9 = fread(local_438,4,__n,(FILE *)this->f);
          if (sVar9 != __n) goto LAB_0037e3d4;
          if (__n != 0) {
            puVar13 = &this->m_Pal[0].r;
            uVar10 = 0;
            do {
              ((_BGR *)(puVar13 + -2))->b = local_438[uVar10 * 4];
              puVar13[-1] = local_438[uVar10 * 4 + 1];
              *puVar13 = local_438[uVar10 * 4 + 2];
              uVar10 = uVar10 + 1;
              puVar13 = puVar13 + 3;
            } while (__n != uVar10);
          }
        }
        else {
          if (local_443 != '\x18') goto LAB_0037e25e;
          sVar9 = fread(this->m_Pal,3,(ulong)local_445,(FILE *)this->f);
        }
        if (sVar9 != local_445) goto LAB_0037e3d4;
      }
      else {
        puVar13 = &this->m_Pal[0].r;
        lVar11 = 0;
        do {
          uVar7 = (uchar)lVar11;
          *puVar13 = uVar7;
          puVar13[-1] = uVar7;
          ((_BGR *)(puVar13 + -2))->b = uVar7;
          lVar11 = lVar11 + 1;
          puVar13 = puVar13 + 3;
        } while (lVar11 != 0x100);
      }
LAB_0037e25e:
      puVar13 = this->m_pBitmap + this->m_NumPixel;
      if ((local_448 & 8) == 0) {
        if (0 < this->m_Yres) {
          iVar8 = 0;
          do {
            puVar13 = puVar13 + -(long)this->m_Xres;
            sVar9 = fread(puVar13,1,(long)this->m_Xres,(FILE *)this->f);
            if (sVar9 != (long)this->m_Xres) goto LAB_0037e3d4;
            iVar8 = iVar8 + 1;
          } while (iVar8 < this->m_Yres);
        }
      }
      else {
        puVar13 = puVar13 + -(long)this->m_Xres;
        this->m_nCount = 0x8000;
        if (this->m_pBitmap <= puVar13) {
          iVar8 = 0;
LAB_0037e2c9:
          bVar6 = Input(this);
          if ((char)bVar6 < '\0') {
            uVar7 = Input(this);
            lVar11 = (long)iVar8;
            lVar12 = 1;
            do {
              puVar13[lVar12 + lVar11 + -1] = uVar7;
              iVar2 = this->m_Xres;
              iVar8 = iVar8 + 1;
              if (iVar8 == iVar2) goto LAB_0037e357;
              lVar12 = lVar12 + 1;
            } while ((0x7f - (uint)bVar6) + (int)lVar12 != 1);
          }
          else {
            lVar11 = (long)iVar8;
            lVar12 = 1;
            do {
              uVar7 = Input(this);
              puVar13[lVar12 + lVar11 + -1] = uVar7;
              iVar2 = this->m_Xres;
              iVar8 = iVar8 + 1;
              if (iVar8 == iVar2) goto LAB_0037e357;
              lVar12 = lVar12 + 1;
            } while ((-1 - (uint)bVar6) + (int)lVar12 != 1);
          }
          goto LAB_0037e359;
        }
      }
    }
LAB_0037e366:
    fclose((FILE *)this->f);
    iVar8 = 0;
  }
  else {
LAB_0037e3d4:
    iVar8 = 0x33;
  }
  return iVar8;
LAB_0037e229:
  puVar13 = puVar13 + (long)iVar2 * -4;
  iVar8 = 0;
LAB_0037e22c:
  if (puVar13 < this->m_pBitmap) goto LAB_0037e366;
  goto LAB_0037e0fa;
LAB_0037e357:
  puVar13 = puVar13 + -(long)iVar2;
  iVar8 = 0;
LAB_0037e359:
  if (puVar13 < this->m_pBitmap) goto LAB_0037e366;
  goto LAB_0037e2c9;
}

Assistant:

int CImage::LoadTga(char *szFilename)
{
  _TGAHEADER      fh;
  int             i, j, k;
  unsigned char   nCount;

  if (!(f = fopen(szFilename, "rb"))) return eLoadTgaFileOpen;
  if (fread(&fh, sizeof(fh), 1, f) != 1) return eLoadTgaFileRead;
  bool bCompressed = (( fh.tiImageType & 8 ) != 0);
  if ((fh.tiBitPerPixel<=0) || (fh.tiBitPerPixel>32))
    return eLoadTgaBadFormat;

  if ( Init( fh.tiXres, fh.tiYres, fh.tiBitPerPixel ) != 0 ) 
    return eLoadTgaInit;

  if ( m_BitPerPixel == 8 )
  {
    if ( fh.tiPaletteIncluded == 1 )
    {
      if ( fh.tiPaletteBpp == 24)
      {
        if (fread(&m_Pal, 3, fh.tiPaletteSize, f) != fh.tiPaletteSize) 
          return eLoadTgaFileRead;
      }
      else
      if ( fh.tiPaletteBpp == 32)
      {
        unsigned char BmpPal[256][4];

        if (fread(&BmpPal, 4, fh.tiPaletteSize, f) != fh.tiPaletteSize) 
          return eLoadTgaFileRead;

        for (i=0; i<fh.tiPaletteSize; i++)
        {
          m_Pal[i].b = BmpPal[i][0];
          m_Pal[i].g = BmpPal[i][1];
          m_Pal[i].r = BmpPal[i][2];
        }
      }
    }
    else
    {
      for (i=0; i<256; i++)
      {
        m_Pal[i].r = i;
        m_Pal[i].g = i;
        m_Pal[i].b = i;
      }
    }

    unsigned char * pcolBuf = m_pBitmap;
    pcolBuf += m_NumPixel;

    if ( !bCompressed )
    {
      for (j=0; j<m_Yres; j++)
      {
        pcolBuf -= m_Xres;
        if (fread(pcolBuf, 1, m_Xres, f) != (size_t)m_Xres) 
          return eLoadTgaFileRead;
      }
    }
    else
    {
      unsigned char colCur;

      pcolBuf -= m_Xres;

      i = 0;
      m_nCount = sizeof(m_cBuf);

      while ( pcolBuf >= m_pBitmap )
      {
        nCount = Input();
        if ((nCount & 128)==0)
        {
          for (k=0; k<=nCount; k++)
          {
            colCur = Input();
            *(pcolBuf+i) = colCur;
            if ( (++i) == m_Xres )
            {
              i=0;
              pcolBuf -= m_Xres;
              break;
            }
          }
        }
        else
        {
          colCur = Input();
          for (k=0; k<=nCount-128; k++)
          {
            *(pcolBuf+i) = colCur;
            if ( (++i) == m_Xres )
            {
              i=0;
              pcolBuf -= m_Xres;
              break;
            }
          }
        }
      }
    }
  }
  else
  if ( m_BitPerPixel == 24 )
  {
    _BGR * pcolBuf = (_BGR *)m_pBitmap;
    pcolBuf += m_NumPixel;

    if ( !bCompressed )
    {
      for (j=0; j<m_Yres; j++)
      {
        pcolBuf -= m_Xres;
        if (fread(pcolBuf, sizeof(_BGR), m_Xres, f) != (size_t)m_Xres) 
          return eLoadTgaFileRead;
      }
    }
    else
    {
      _BGR colCur;

      pcolBuf -= m_Xres;

      i = 0;
      m_nCount = sizeof(m_cBuf);

      while ( pcolBuf >= (_BGR *)m_pBitmap )
      {
        nCount = Input();
        if ((nCount & 128)==0)
        {
          for (k=0; k<=nCount; k++)
          {
            colCur.b = Input();
            colCur.g = Input();
            colCur.r = Input();
            *(pcolBuf+i) = colCur;
            if ( (++i) == m_Xres )
            {
              i=0;
              pcolBuf -= m_Xres;
              break;
            }
          }
        }
        else
        {
          colCur.b = Input();
          colCur.g = Input();
          colCur.r = Input();
          for (k=0; k<=nCount-128; k++)
          {
            *(pcolBuf+i) = colCur;
            if ( (++i) == m_Xres )
            {
              i=0;
              pcolBuf -= m_Xres;
              break;
            }
          }
        }
      }
    }
  }
  else
  if ( m_BitPerPixel == 32 )
  {
    _BGRA * pcolBuf = (_BGRA *)m_pBitmap;
    pcolBuf += m_NumPixel;

    if ( !bCompressed )
    {
      for (j=0; j<m_Yres; j++)
      {
        pcolBuf -= m_Xres;
        if (fread(pcolBuf, sizeof(_BGRA), m_Xres, f) != (size_t)m_Xres) 
          return eLoadTgaFileRead;
      }
    }
    else
    {
      _BGRA colCur;

      pcolBuf -= m_Xres;

      i = 0;
      m_nCount = sizeof(m_cBuf);

      while ( pcolBuf >= (_BGRA *)m_pBitmap )
      {
        nCount = Input();
        if ((nCount & 128)==0)
        {
          for (k=0; k<=nCount; k++)
          {
            colCur.b = Input();
            colCur.g = Input();
            colCur.r = Input();
            colCur.a = Input();
            *(pcolBuf+i) = colCur;
            if ( (++i) == m_Xres )
            {
              i=0;
              pcolBuf -= m_Xres;
              break;
            }
          }
        }
        else
        {
          colCur.b = Input();
          colCur.g = Input();
          colCur.r = Input();
          colCur.a = Input();
          for (k=0; k<=nCount-128; k++)
          {
            *(pcolBuf+i) = colCur;
            if ( (++i) == m_Xres )
            {
              i=0;
              pcolBuf -= m_Xres;
              break;
            }
          }
        }
      }
    }
  }
  else 
    return eLoadTgaColorDepth;

  fclose(f);

  return 0;
}